

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O0

void HTS_Vocoder_initialize_excitation(HTS_Vocoder *v,double pitch,size_t nlpf)

{
  void *pvVar1;
  size_t in_RSI;
  long in_RDI;
  undefined8 in_XMM0_Qa;
  size_t i;
  size_t in_stack_ffffffffffffffe0;
  ulong uVar2;
  
  *(undefined8 *)(in_RDI + 0x40) = in_XMM0_Qa;
  *(undefined8 *)(in_RDI + 0x48) = in_XMM0_Qa;
  *(undefined8 *)(in_RDI + 0x50) = 0;
  if (in_RSI == 0) {
    *(undefined8 *)(in_RDI + 0x60) = 0;
    *(undefined8 *)(in_RDI + 0x58) = 0;
    *(undefined8 *)(in_RDI + 0x68) = 0;
  }
  else {
    *(size_t *)(in_RDI + 0x60) = in_RSI;
    pvVar1 = HTS_calloc(in_RSI,in_stack_ffffffffffffffe0);
    *(void **)(in_RDI + 0x58) = pvVar1;
    for (uVar2 = 0; uVar2 < *(ulong *)(in_RDI + 0x60); uVar2 = uVar2 + 1) {
      *(undefined8 *)(*(long *)(in_RDI + 0x58) + uVar2 * 8) = 0;
    }
    *(undefined8 *)(in_RDI + 0x68) = 0;
  }
  return;
}

Assistant:

static void HTS_Vocoder_initialize_excitation(HTS_Vocoder * v, double pitch, size_t nlpf)
{
   size_t i;

   v->pitch_of_curr_point = pitch;
   v->pitch_counter = pitch;
   v->pitch_inc_per_point = 0.0;
   if (nlpf > 0) {
      v->excite_buff_size = nlpf;
      v->excite_ring_buff = (double *) HTS_calloc(v->excite_buff_size, sizeof(double));
      for (i = 0; i < v->excite_buff_size; i++)
         v->excite_ring_buff[i] = 0.0;
      v->excite_buff_index = 0;
   } else {
      v->excite_buff_size = 0;
      v->excite_ring_buff = NULL;
      v->excite_buff_index = 0;
   }
}